

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngpread.c
# Opt level: O0

size_t png_process_data_pause(png_structrp png_ptr,int save)

{
  ulong uVar1;
  size_t remaining;
  int save_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    if (save == 0) {
      uVar1 = png_ptr->buffer_size;
      png_ptr->buffer_size = 0;
      if (png_ptr->save_buffer_size < uVar1) {
        return uVar1 - png_ptr->save_buffer_size;
      }
    }
    else {
      png_push_save_buffer(png_ptr);
    }
  }
  return 0;
}

Assistant:

size_t PNGAPI
png_process_data_pause(png_structrp png_ptr, int save)
{
   if (png_ptr != NULL)
   {
      /* It's easiest for the caller if we do the save; then the caller doesn't
       * have to supply the same data again:
       */
      if (save != 0)
         png_push_save_buffer(png_ptr);
      else
      {
         /* This includes any pending saved bytes: */
         size_t remaining = png_ptr->buffer_size;
         png_ptr->buffer_size = 0;

         /* So subtract the saved buffer size, unless all the data
          * is actually 'saved', in which case we just return 0
          */
         if (png_ptr->save_buffer_size < remaining)
            return remaining - png_ptr->save_buffer_size;
      }
   }

   return 0;
}